

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.c
# Opt level: O1

int64_t time_util_hhmmss_ss_to_utime(double time)

{
  int iVar1;
  double dVar2;
  
  dVar2 = fmod(time,100.0);
  iVar1 = (int)time % 10000;
  return ((ulong)(((int)time / 10000 & 0xffU) * 360000 +
                 ((uint)((ulong)((long)iVar1 * 0x51eb851f) >> 0x25) - (iVar1 >> 0x1f) & 0xff) * 6000
                 ) + (long)(dVar2 * 100.0 + 0.0)) * 10000;
}

Assistant:

int64_t time_util_hhmmss_ss_to_utime(double time)
{
    int64_t utime = 0;

    int itime = ((int) time);

    double seconds = fmod(time, 100.0);
    uint8_t minutes = (itime % 10000) / 100;
    uint8_t hours =  itime / 10000;

    utime += seconds *   100;
    utime += minutes *  6000;
    utime += hours   *360000;

    utime *= 10000;

    return utime;
}